

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

int reserve_ds(flatcc_builder_t *B,size_t need,flatbuffers_uoffset_t limit)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar1 = (*B->alloc)(B->alloc_context,B->buffers + 1,B->ds_first + need,1,1);
  iVar2 = -1;
  if (iVar1 == 0) {
    B->ds = (uint8_t *)((ulong)B->ds_first + (long)B->buffers[1].iov_base);
    uVar3 = (int)B->buffers[1].iov_len - B->ds_first;
    if (limit <= uVar3) {
      uVar3 = limit;
    }
    B->ds_limit = uVar3;
    B->frame->type_limit = limit;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int reserve_ds(flatcc_builder_t *B, size_t need, uoffset_t limit)
{
    iovec_t *buf = B->buffers + flatcc_builder_alloc_ds;

    if (B->alloc(B->alloc_context, buf, B->ds_first + need, 1, flatcc_builder_alloc_ds)) {
        return -1;
    }
    refresh_ds(B, limit);
    return 0;
}